

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

uint8_t url_hex_val(char c)

{
  byte bVar1;
  
  bVar1 = c - 0x30;
  if (9 < bVar1) {
    if ((byte)(c + 0xbfU) < 6) {
      bVar1 = c - 0x37;
    }
    else {
      bVar1 = c + 0xa9;
      if (5 < (byte)(c + 0x9fU)) {
        bVar1 = 0;
      }
    }
  }
  return bVar1;
}

Assistant:

static uint8_t
url_hex_val(char c)
{
	if ((c >= '0') && (c <= '9')) {
		return (c - '0');
	}
	if ((c >= 'A') && (c <= 'F')) {
		return ((c - 'A') + 10);
	}
	if ((c >= 'a') && (c <= 'f')) {
		return ((c - 'a') + 10);
	}
	return (0);
}